

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O2

Aig_Man_t * createNewAigWith0LivePo(Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live)

{
  Aig_Man_t *pNewAig;
  size_t sVar1;
  char *__s;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  pNewAig = Aig_ManStart(pAig->vObjs->nSize);
  sVar1 = strlen(pAig->pName);
  __s = (char *)malloc(sVar1 + 7);
  pNewAig->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"0Live");
  pNewAig->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNewAig->pConst1;
  for (iVar6 = 0; iVar6 < pAig->nTruePis; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar6);
    pAVar3 = Aig_ObjCreateCi(pNewAig);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    pAVar3 = Aig_ObjCreateCi(pNewAig);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar6);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      if (((ulong)pAVar3 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pAVar3->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_And(pNewAig,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (iVar6 = 0; iVar6 < pAig->nTruePos; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(pNewAig,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  pAVar3 = createConstrained0LiveCone(pNewAig,signalList);
  Aig_ObjCreateCo(pNewAig,pAVar3);
  *index0Live = iVar6;
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(pNewAig,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  Aig_ManSetRegNum(pNewAig,pAig->nRegs);
  Aig_ManCleanup(pNewAig);
  iVar6 = Aig_ManCheck(pNewAig);
  if (iVar6 != 0) {
    return pNewAig;
  }
  __assert_fail("Aig_ManCheck( pNewAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kLiveConstraints.c"
                ,0x8c,"Aig_Man_t *createNewAigWith0LivePo(Aig_Man_t *, Vec_Ptr_t *, int *)");
}

Assistant:

Aig_Man_t *createNewAigWith0LivePo( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveCone( pNewAig, signalList );
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriver );
	*index0Live = i;

	Saig_ManForEachLi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	Aig_ManSetRegNum( pNewAig, Aig_ManRegNum(pAig) );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );
	return pNewAig;
}